

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O1

void cft_fasttext_labels_free(fasttext_labels_t *labels)

{
  ulong uVar1;
  
  if (labels != (fasttext_labels_t *)0x0) {
    if (labels->length != 0) {
      uVar1 = 0;
      do {
        free(labels->labels[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < labels->length);
    }
    free(labels->labels);
    free(labels->freqs);
    free(labels);
    return;
  }
  return;
}

Assistant:

void cft_fasttext_labels_free(fasttext_labels_t* labels) {
    if (labels == nullptr) {
        return;
    }
    for (size_t i = 0; i < labels->length; i++) {
        free(labels->labels[i]);
    }
    free(labels->labels);
    free(labels->freqs);
    free(labels);
}